

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.cpp
# Opt level: O3

void * SSC32Thread(void *pParam)

{
  ulong uVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  SOCKET SVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  double dVar16;
  double dVar17;
  int pws [32];
  int selectedchannels [32];
  CHRONO chrono_period;
  SSC32 ssc32;
  char szTemp [256];
  char szSaveFilePath [256];
  int local_db4;
  int local_dac;
  int local_da8 [32];
  double local_d28;
  undefined8 uStack_d20;
  double local_d18;
  undefined8 uStack_d10;
  timespec local_d08;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_ce8;
  undefined8 uStack_ce0;
  undefined8 local_cd8;
  undefined8 uStack_cd0;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_ca8;
  undefined8 uStack_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  timespec local_c80;
  long local_c70;
  long lStack_c68;
  long local_c60;
  long lStack_c58;
  timespec local_c50;
  int local_c40;
  double local_c38;
  undefined8 uStack_c30;
  SSC32 local_c20;
  char local_238 [256];
  char local_138 [264];
  
  memset(&local_c20,0,0x9e8);
  iVar5 = clock_getres(4,&local_c50);
  if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_c80), iVar5 == 0)) {
    local_c40 = 0;
    local_c70 = 0;
    lStack_c68 = 0;
    local_c60 = 0;
    lStack_c58 = 0;
  }
  local_db4 = 0x32;
  bVar4 = false;
  bVar3 = false;
  local_dac = 0;
LAB_0019974b:
  bVar3 = !bVar3;
  while( true ) {
    if (local_c40 == 0) {
      clock_gettime(4,&local_d08);
      local_c70 = local_d08.tv_sec;
      lStack_c68 = local_d08.tv_nsec;
      local_d08.tv_sec =
           ((local_d08.tv_sec + local_c60) - local_c80.tv_sec) +
           (local_d08.tv_nsec + lStack_c58) / 1000000000;
      local_d08.tv_nsec = (local_d08.tv_nsec + lStack_c58) % 1000000000 - local_c80.tv_nsec;
      if (local_d08.tv_nsec < 0) {
        local_d08.tv_sec = local_d08.tv_sec + ~((ulong)-local_d08.tv_nsec / 1000000000);
        local_d08.tv_nsec =
             local_d08.tv_nsec + 1000000000 + ((ulong)-local_d08.tv_nsec / 1000000000) * 1000000000;
      }
      local_c60 = local_d08.tv_sec;
      lStack_c58 = local_d08.tv_nsec;
    }
    iVar5 = clock_getres(4,&local_c50);
    if ((iVar5 == 0) && (iVar5 = clock_gettime(4,&local_c80), iVar5 == 0)) {
      local_c40 = 0;
      local_c60 = 0;
      lStack_c58 = 0;
      local_c70 = 0;
      lStack_c68 = 0;
    }
    local_d08.tv_sec = (long)(local_db4 / 1000);
    local_d08.tv_nsec = (long)((local_db4 % 1000) * 1000000);
    nanosleep(&local_d08,(timespec *)0x0);
    if (bPauseSSC32 == 0) break;
    if (!bVar3) {
      puts("SSC32 paused.");
      SVar10 = local_c20.RS232Port.s;
      switch(local_c20.RS232Port.DevType) {
      case 0:
        iVar5 = (int)local_c20.RS232Port.hDev;
        goto LAB_00199962;
      case 1:
      case 3:
        iVar5 = local_c20.RS232Port.s;
        break;
      case 2:
        shutdown(local_c20.RS232Port.s,2);
        close(SVar10);
      case 4:
        iVar5 = local_c20.RS232Port.s_srv;
        break;
      default:
        goto switchD_00199924_default;
      }
      shutdown(iVar5,2);
LAB_00199962:
      iVar5 = close(iVar5);
      pcVar12 = "SSC32 disconnected.";
      if (iVar5 != 0) {
switchD_00199924_default:
        pcVar12 = "SSC32 disconnection failed.";
      }
      puts(pcVar12);
    }
    if (bExit != 0) {
      bVar15 = true;
      goto LAB_0019a6cf;
    }
    local_d08.tv_sec = 0;
    local_d08.tv_nsec = 100000000;
    nanosleep(&local_d08,(timespec *)0x0);
    bVar3 = true;
  }
  if (bRestartSSC32 == 0) {
    if (bVar3) goto LAB_00199c82;
    if (robid < 0x4000) {
      if (robid == 0x400) {
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        rudderminangle = local_c20.MinAngle;
        ruddermidangle = local_c20.MidAngle;
        ruddermaxangle = local_c20.MaxAngle;
        local_d18 = ABS(local_c20.MinAngle);
        if (ABS(local_c20.MinAngle) <= ABS(local_c20.MaxAngle)) {
          local_d18 = ABS(local_c20.MaxAngle);
        }
        local_d18 = local_d18 * -uw_f;
        uStack_d10 = 0;
        if (bEnableFluxMotorboat == 0) {
          bVar15 = bEnableBackwardsMotorboat == 0;
          bVar3 = u_f < 0.0;
          local_d28 = u_f * 1000.0;
          uStack_d20 = 0;
          pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
          local_d08.tv_sec = 0;
          local_d08.tv_nsec = 0;
          local_cf8 = 0;
          uStack_cf0 = 0;
          local_ce8 = 0;
          uStack_ce0 = 0;
          local_cd8 = 0;
          uStack_cd0 = 0;
          local_cc8 = 0;
          uStack_cc0 = 0;
          local_cb8 = 0;
          uStack_cb0 = 0;
          local_ca8 = 0;
          uStack_ca0 = 0;
          local_c98 = 0;
          uStack_c90 = 0;
          local_da8[0] = 0;
          local_da8[1] = 0;
          local_da8[2] = 0;
          local_da8[3] = 0;
          local_da8[4] = 0;
          local_da8[5] = 0;
          local_da8[6] = 0;
          local_da8[7] = 0;
          local_da8[8] = 0;
          local_da8[9] = 0;
          local_da8[10] = 0;
          local_da8[0xb] = 0;
          local_da8[0xc] = 0;
          local_da8[0xd] = 0;
          local_da8[0xe] = 0;
          local_da8[0xf] = 0;
          local_da8[0x10] = 0;
          local_da8[0x11] = 0;
          local_da8[0x12] = 0;
          local_da8[0x13] = 0;
          local_da8[0x14] = 0;
          local_da8[0x15] = 0;
          local_da8[0x16] = 0;
          local_da8[0x17] = 0;
          local_da8[0x18] = 0;
          local_da8[0x19] = 0;
          local_da8[0x1a] = 0;
          local_da8[0x1b] = 0;
          local_da8[0x1c] = 0;
          local_da8[0x1d] = 0;
          local_da8[0x1e] = 0;
          local_da8[0x1f] = 0;
          if (0.0 <= local_d18) {
            dVar17 = local_c20.MaxAngle - local_c20.MidAngle;
          }
          else {
            dVar17 = local_c20.MidAngle - local_c20.MinAngle;
          }
          dVar16 = ABS(local_c20.MinAngle);
          if (ABS(local_c20.MinAngle) <= ABS(local_c20.MaxAngle)) {
            dVar16 = ABS(local_c20.MaxAngle);
          }
          lVar7 = (long)local_c20.rudderchan;
          local_da8[lVar7] =
               (int)(((local_c20.MidAngle + (local_d18 * dVar17) / dVar16) * 500.0) / dVar16) +
               0x5dc;
          iVar5 = (int)(local_d28 * 0.5) + 0x5dc;
          if (bVar15 && bVar3) {
            iVar5 = 0x5dc;
          }
          lVar8 = (long)local_c20.rightthrusterchan;
          local_da8[lVar8] = iVar5;
          iVar5 = local_da8[lVar7];
          if (1999 < iVar5) {
            iVar5 = 2000;
          }
          if (iVar5 < 0x3e9) {
            iVar5 = 1000;
          }
          local_da8[lVar7] = iVar5;
          iVar5 = local_da8[lVar8];
          if (1999 < iVar5) {
            iVar5 = 2000;
          }
          if (iVar5 < 0x3e9) {
            iVar5 = 1000;
          }
          local_da8[lVar8] = iVar5;
          *(undefined4 *)((long)&local_d08.tv_sec + lVar7 * 4) = 1;
          *(undefined4 *)((long)&local_d08.tv_sec + lVar8 * 4) = 1;
          iVar5 = SetAllPWMsSSC32(&local_c20,(int *)&local_d08,local_da8);
          if (iVar5 == 0) goto LAB_00199e16;
          puts("Connection to a SSC32 lost.");
          switch(local_c20.RS232Port.DevType) {
          case 0:
            goto switchD_00199f52_caseD_0;
          case 1:
          case 3:
            goto switchD_00199f52_caseD_1;
          case 2:
            goto switchD_00199f52_caseD_2;
          case 4:
            goto switchD_00199f52_caseD_4;
          }
          goto switchD_00199f52_default;
        }
        local_c38 = ABS(u_f);
        if (bEnableBackwardsMotorboat == 0) {
          local_c38 = (double)(~-(ulong)(u_f < 0.0) & (ulong)local_c38);
          local_d28 = 1.0;
        }
        else {
          local_d28 = *(double *)(&DAT_001dd690 + (ulong)(u_f < 0.0) * 8);
        }
        uStack_c30 = 0;
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        iVar5 = SetRudderThrustersFluxSSC32
                          (&local_c20,local_d18,local_c38,local_c38,local_d28,local_d28);
        if (iVar5 != 0) {
          puts("Connection to a SSC32 lost.");
          switch(local_c20.RS232Port.DevType) {
          case 0:
            goto switchD_00199f52_caseD_0;
          case 1:
          case 3:
            goto switchD_00199f52_caseD_1;
          case 2:
            goto switchD_00199f52_caseD_2;
          case 4:
            goto switchD_00199f52_caseD_4;
          default:
            goto switchD_00199f52_default;
          }
        }
        goto LAB_00199e16;
      }
      if (robid != 0x2000) goto LAB_0019a033;
      if (bVar4 || bCheckRudder == 0) {
LAB_0019a487:
        pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
        rudderminangle = local_c20.MinAngle;
        ruddermidangle = local_c20.MidAngle;
        ruddermaxangle = local_c20.MaxAngle;
        local_d18 = ABS(local_c20.MinAngle);
        if (ABS(local_c20.MinAngle) <= ABS(local_c20.MaxAngle)) {
          local_d18 = ABS(local_c20.MaxAngle);
        }
        local_d18 = local_d18 * -uw_f;
        uStack_d10 = 0;
        pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
        if (0.0 <= local_d18) {
          dVar17 = local_c20.MaxAngle - local_c20.MidAngle;
        }
        else {
          dVar17 = local_c20.MidAngle - local_c20.MinAngle;
        }
        dVar16 = ABS(local_c20.MinAngle);
        if (ABS(local_c20.MinAngle) <= ABS(local_c20.MaxAngle)) {
          dVar16 = ABS(local_c20.MaxAngle);
        }
        iVar5 = (int)(((local_c20.MidAngle + (local_d18 * dVar17) / dVar16) * 500.0) / dVar16);
        if (499 < iVar5) {
          iVar5 = 500;
        }
        if (iVar5 < -499) {
          iVar5 = -500;
        }
        iVar5 = SetPWMSSC32(&local_c20,local_c20.rudderchan,iVar5 + 0x5dc);
        if (iVar5 != 0) {
          puts("Connection to a SSC32 lost.");
          switch(local_c20.RS232Port.DevType) {
          case 0:
            goto switchD_00199f52_caseD_0;
          case 1:
          case 3:
            goto switchD_00199f52_caseD_1;
          case 2:
            goto switchD_00199f52_caseD_2;
          case 4:
            goto switchD_00199f52_caseD_4;
          }
          goto switchD_00199f52_default;
        }
        goto LAB_00199e16;
      }
      iVar5 = CheckRudderSSC32(&local_c20);
      if (iVar5 == 0) {
        bVar4 = true;
        goto LAB_0019a487;
      }
      puts("Connection to a SSC32 lost.");
      SVar10 = local_c20.RS232Port.s;
      switch(local_c20.RS232Port.DevType) {
      case 0:
        iVar5 = (int)local_c20.RS232Port.hDev;
        goto LAB_0019a693;
      case 1:
      case 3:
        iVar5 = local_c20.RS232Port.s;
        break;
      case 2:
        shutdown(local_c20.RS232Port.s,2);
        close(SVar10);
      case 4:
        iVar5 = local_c20.RS232Port.s_srv;
        break;
      default:
        goto switchD_00199c15_default;
      }
      shutdown(iVar5,2);
LAB_0019a693:
      iVar5 = close(iVar5);
      pcVar12 = "SSC32 disconnected.";
      if (iVar5 != 0) {
switchD_00199c15_default:
        pcVar12 = "SSC32 disconnection failed.";
      }
      puts(pcVar12);
      bVar4 = false;
      goto LAB_00199cbc;
    }
    if (((robid == 0x4000) || (robid == 0x200000)) || (robid == 0x8000)) {
      pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
      rudderminangle = local_c20.MinAngle;
      ruddermidangle = local_c20.MidAngle;
      ruddermaxangle = local_c20.MaxAngle;
      local_d28 = ABS(local_c20.MinAngle);
      if (ABS(local_c20.MinAngle) <= ABS(local_c20.MaxAngle)) {
        local_d28 = ABS(local_c20.MaxAngle);
      }
      local_d28 = local_d28 * -uw_f;
      uStack_d20 = 0;
      local_d18 = u_f;
      pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
      local_d08.tv_sec = 0;
      local_d08.tv_nsec = 0;
      local_cf8 = 0;
      uStack_cf0 = 0;
      local_ce8 = 0;
      uStack_ce0 = 0;
      local_cd8 = 0;
      uStack_cd0 = 0;
      local_cc8 = 0;
      uStack_cc0 = 0;
      local_cb8 = 0;
      uStack_cb0 = 0;
      local_ca8 = 0;
      uStack_ca0 = 0;
      local_c98 = 0;
      uStack_c90 = 0;
      local_da8[0] = 0;
      local_da8[1] = 0;
      local_da8[2] = 0;
      local_da8[3] = 0;
      local_da8[4] = 0;
      local_da8[5] = 0;
      local_da8[6] = 0;
      local_da8[7] = 0;
      local_da8[8] = 0;
      local_da8[9] = 0;
      local_da8[10] = 0;
      local_da8[0xb] = 0;
      local_da8[0xc] = 0;
      local_da8[0xd] = 0;
      local_da8[0xe] = 0;
      local_da8[0xf] = 0;
      local_da8[0x10] = 0;
      local_da8[0x11] = 0;
      local_da8[0x12] = 0;
      local_da8[0x13] = 0;
      local_da8[0x14] = 0;
      local_da8[0x15] = 0;
      local_da8[0x16] = 0;
      local_da8[0x17] = 0;
      local_da8[0x18] = 0;
      local_da8[0x19] = 0;
      local_da8[0x1a] = 0;
      local_da8[0x1b] = 0;
      local_da8[0x1c] = 0;
      local_da8[0x1d] = 0;
      local_da8[0x1e] = 0;
      local_da8[0x1f] = 0;
      if (0.0 <= local_d28) {
        dVar17 = local_c20.MaxAngle - local_c20.MidAngle;
      }
      else {
        dVar17 = local_c20.MidAngle - local_c20.MinAngle;
      }
      dVar16 = ABS(local_c20.MinAngle);
      if (ABS(local_c20.MinAngle) <= ABS(local_c20.MaxAngle)) {
        dVar16 = ABS(local_c20.MaxAngle);
      }
      lVar8 = (long)local_c20.rudderchan;
      dVar2 = local_d18 * 1000.0;
      local_da8[lVar8] =
           (int)(((local_c20.MidAngle + (local_d28 * dVar17) / dVar16) * 500.0) / dVar16) + 0x5dc;
      lVar7 = (long)local_c20.rightthrusterchan;
      local_da8[lVar7] = (int)(dVar2 * 0.5) + 0x5dc;
      iVar5 = local_da8[lVar8];
      if (1999 < iVar5) {
        iVar5 = 2000;
      }
      if (iVar5 < 0x3e9) {
        iVar5 = 1000;
      }
      local_da8[lVar8] = iVar5;
      iVar5 = local_da8[lVar7];
      if (1999 < iVar5) {
        iVar5 = 2000;
      }
      if (iVar5 < 0x3e9) {
        iVar5 = 1000;
      }
      local_da8[lVar7] = iVar5;
      *(undefined4 *)((long)&local_d08.tv_sec + lVar8 * 4) = 1;
      *(undefined4 *)((long)&local_d08.tv_sec + lVar7 * 4) = 1;
      iVar5 = SetAllPWMsSSC32(&local_c20,(int *)&local_d08,local_da8);
      if (iVar5 != 0) {
        puts("Connection to a SSC32 lost.");
        switch(local_c20.RS232Port.DevType) {
        case 0:
          goto switchD_00199f52_caseD_0;
        case 1:
        case 3:
          goto switchD_00199f52_caseD_1;
        case 2:
          goto switchD_00199f52_caseD_2;
        case 4:
          goto switchD_00199f52_caseD_4;
        }
        goto switchD_00199f52_default;
      }
      goto LAB_00199e16;
    }
LAB_0019a033:
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    local_d28 = u1 * 1000.0;
    local_d18 = u2 * 1000.0;
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    local_d08.tv_sec = 0;
    local_d08.tv_nsec = 0;
    local_cf8 = 0;
    uStack_cf0 = 0;
    local_ce8 = 0;
    uStack_ce0 = 0;
    local_cd8 = 0;
    uStack_cd0 = 0;
    local_cc8 = 0;
    uStack_cc0 = 0;
    local_cb8 = 0;
    uStack_cb0 = 0;
    local_ca8 = 0;
    uStack_ca0 = 0;
    local_da8[0] = 0;
    local_da8[1] = 0;
    local_da8[2] = 0;
    local_da8[3] = 0;
    local_da8[4] = 0;
    local_da8[5] = 0;
    local_da8[6] = 0;
    local_da8[7] = 0;
    local_da8[8] = 0;
    local_da8[9] = 0;
    local_da8[10] = 0;
    local_da8[0xb] = 0;
    local_da8[0xc] = 0;
    local_da8[0xd] = 0;
    local_da8[0xe] = 0;
    local_da8[0xf] = 0;
    local_da8[0x10] = 0;
    local_da8[0x11] = 0;
    local_da8[0x12] = 0;
    local_da8[0x13] = 0;
    local_da8[0x14] = 0;
    local_da8[0x15] = 0;
    local_da8[0x16] = 0;
    local_da8[0x17] = 0;
    local_da8[0x18] = 0;
    local_da8[0x19] = 0;
    local_da8[0x1a] = 0;
    local_da8[0x1b] = 0;
    local_da8[0x1c] = 0;
    local_da8[0x1d] = 0;
    local_da8[0x1e] = 0;
    local_da8[0x1f] = 0;
    lVar8 = (long)local_c20.rightthrusterchan;
    dVar17 = local_d18 * 0.5;
    local_da8[lVar8] = (int)(local_d28 * 0.5) + 0x5dc;
    lVar7 = (long)local_c20.leftthrusterchan;
    local_da8[lVar7] = (int)dVar17 + 0x5dc;
    iVar5 = local_da8[lVar8];
    if (1999 < iVar5) {
      iVar5 = 2000;
    }
    if (iVar5 < 0x3e9) {
      iVar5 = 1000;
    }
    local_da8[lVar8] = iVar5;
    iVar5 = local_da8[lVar7];
    if (1999 < local_da8[lVar7]) {
      iVar5 = 2000;
    }
    local_c98 = 0;
    uStack_c90 = 0;
    if (iVar5 < 0x3e9) {
      iVar5 = 1000;
    }
    local_da8[lVar7] = iVar5;
    *(undefined4 *)((long)&local_d08.tv_sec + lVar8 * 4) = 1;
    *(undefined4 *)((long)&local_d08.tv_sec + lVar7 * 4) = 1;
    iVar5 = SetAllPWMsSSC32(&local_c20,(int *)&local_d08,local_da8);
    if (iVar5 != 0) {
      puts("Connection to a SSC32 lost.");
      switch(local_c20.RS232Port.DevType) {
      case 0:
switchD_00199f52_caseD_0:
        iVar5 = (int)local_c20.RS232Port.hDev;
        goto LAB_0019a628;
      case 1:
      case 3:
switchD_00199f52_caseD_1:
        iVar5 = local_c20.RS232Port.s;
        goto LAB_0019a61b;
      case 2:
switchD_00199f52_caseD_2:
        SVar10 = local_c20.RS232Port.s;
        shutdown(local_c20.RS232Port.s,2);
        close(SVar10);
      case 4:
switchD_00199f52_caseD_4:
        iVar5 = local_c20.RS232Port.s_srv;
LAB_0019a61b:
        shutdown(iVar5,2);
LAB_0019a628:
        iVar5 = close(iVar5);
        pcVar12 = "SSC32 disconnected.";
        if (iVar5 != 0) {
switchD_00199f52_default:
          pcVar12 = "SSC32 disconnection failed.";
        }
        break;
      default:
        goto switchD_00199f52_default;
      }
      puts(pcVar12);
      goto LAB_00199cbc;
    }
  }
  else {
    if (!bVar3) {
      puts("Restarting a SSC32.");
      SVar10 = local_c20.RS232Port.s;
      switch(local_c20.RS232Port.DevType) {
      case 0:
        iVar5 = (int)local_c20.RS232Port.hDev;
        goto LAB_00199c56;
      case 1:
      case 3:
        iVar5 = local_c20.RS232Port.s;
        break;
      case 2:
        shutdown(local_c20.RS232Port.s,2);
        close(SVar10);
      case 4:
        iVar5 = local_c20.RS232Port.s_srv;
        break;
      default:
        goto switchD_00199a0d_default;
      }
      shutdown(iVar5,2);
LAB_00199c56:
      iVar5 = close(iVar5);
      pcVar12 = "SSC32 disconnected.";
      if (iVar5 != 0) {
switchD_00199a0d_default:
        pcVar12 = "SSC32 disconnection failed.";
      }
      puts(pcVar12);
    }
    bRestartSSC32 = 0;
LAB_00199c82:
    iVar5 = ConnectSSC32(&local_c20,"SSC320.txt");
    if (iVar5 != 0) {
      local_d08.tv_sec = 1;
      local_d08.tv_nsec = 0;
      nanosleep(&local_d08,(timespec *)0x0);
LAB_00199cbc:
      local_dac = local_dac + 1;
      if (ExitOnErrorCount <= local_dac && 0 < ExitOnErrorCount) {
        bExit = 1;
        bVar15 = true;
        goto LAB_0019a6cf;
      }
      bVar3 = false;
      bVar15 = true;
      goto LAB_00199e19;
    }
    local_db4 = local_c20.threadperiod;
    if ((FILE *)local_c20.pfSaveFile != (FILE *)0x0) {
      fclose((FILE *)local_c20.pfSaveFile);
      local_c20.pfSaveFile = (FILE *)0x0;
    }
    if (local_c20.bSaveRawData == 0) goto LAB_00199e16;
    if (local_c20.szCfgFilePath[0] == '\0') {
      builtin_strncpy(local_238,"ssc32",6);
    }
    else {
      sprintf(local_238,"%.127s",local_c20.szCfgFilePath);
    }
    sVar6 = strlen(local_238);
    iVar5 = (int)sVar6 + 1;
    uVar9 = sVar6 & 0xffffffff;
    do {
      if ((int)uVar9 < 1) goto LAB_00199daa;
      uVar1 = uVar9 - 1;
      iVar5 = iVar5 + -1;
      lVar7 = uVar9 - 1;
      uVar9 = uVar1;
    } while (local_238[lVar7] != '.');
    if ((uVar1 != 0) && (iVar5 <= (int)sVar6)) {
      memset(local_238 + (uVar1 & 0xffffffff),0,sVar6 - (uVar1 & 0xffffffff));
    }
LAB_00199daa:
    pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
    pcVar12 = strtimeex_fns();
    sprintf(local_138,"log/%.127s_%.64s.txt",local_238,pcVar12);
    pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
    local_c20.pfSaveFile = (FILE *)fopen(local_138,"wb");
    if ((FILE *)local_c20.pfSaveFile == (FILE *)0x0) {
      puts("Unable to create SSC32 data file.");
      bVar15 = false;
      goto LAB_0019a6cf;
    }
  }
LAB_00199e16:
  bVar3 = true;
  bVar15 = false;
LAB_00199e19:
  if (bExit != 0) goto LAB_0019a6cf;
  goto LAB_0019974b;
LAB_0019a6cf:
  if (robid < 0x4000) {
    if (robid == 0x400) {
      if (bEnableFluxMotorboat == 0) {
        local_d08.tv_sec = 0;
        local_d08.tv_nsec = 0;
        local_cf8 = 0;
        uStack_cf0 = 0;
        local_ce8 = 0;
        uStack_ce0 = 0;
        local_cd8 = 0;
        uStack_cd0 = 0;
        local_cc8 = 0;
        uStack_cc0 = 0;
        local_cb8 = 0;
        uStack_cb0 = 0;
        local_ca8 = 0;
        uStack_ca0 = 0;
        local_da8[0] = 0;
        local_da8[1] = 0;
        local_da8[2] = 0;
        local_da8[3] = 0;
        local_da8[4] = 0;
        local_da8[5] = 0;
        local_da8[6] = 0;
        local_da8[7] = 0;
        local_da8[8] = 0;
        local_da8[9] = 0;
        local_da8[10] = 0;
        local_da8[0xb] = 0;
        local_da8[0xc] = 0;
        local_da8[0xd] = 0;
        local_da8[0xe] = 0;
        local_da8[0xf] = 0;
        local_da8[0x10] = 0;
        local_da8[0x11] = 0;
        local_da8[0x12] = 0;
        local_da8[0x13] = 0;
        local_da8[0x14] = 0;
        local_da8[0x15] = 0;
        local_da8[0x16] = 0;
        local_da8[0x17] = 0;
        local_da8[0x18] = 0;
        local_da8[0x19] = 0;
        local_da8[0x1a] = 0;
        local_da8[0x1b] = 0;
        local_da8[0x1c] = 0;
        local_da8[0x1d] = 0;
        local_da8[0x1e] = 0;
        local_da8[0x1f] = 0;
        dVar17 = ABS(local_c20.MinAngle);
        if (ABS(local_c20.MinAngle) <= ABS(local_c20.MaxAngle)) {
          dVar17 = ABS(local_c20.MaxAngle);
        }
        lVar8 = (long)local_c20.rudderchan;
        local_da8[lVar8] =
             (int)(((((local_c20.MaxAngle - local_c20.MidAngle) * 0.0) / dVar17 + local_c20.MidAngle
                    ) * 500.0) / dVar17) + 0x5dc;
        lVar7 = (long)local_c20.rightthrusterchan;
        local_da8[lVar7] = 0x5dc;
        iVar5 = local_da8[lVar8];
        if (1999 < iVar5) {
          iVar5 = 2000;
        }
        if (iVar5 < 0x3e9) {
          iVar5 = 1000;
        }
        local_da8[lVar8] = iVar5;
        iVar5 = 2000;
        if (local_da8[lVar7] < 2000) {
          iVar5 = local_da8[lVar7];
        }
        local_c98 = 0;
        uStack_c90 = 0;
        if (iVar5 < 0x3e9) {
          iVar5 = 1000;
        }
        local_da8[lVar7] = iVar5;
        *(undefined4 *)((long)&local_d08.tv_sec + lVar8 * 4) = 1;
        *(undefined4 *)((long)&local_d08.tv_sec + lVar7 * 4) = 1;
      }
      else {
        local_d08.tv_sec = 0;
        local_d08.tv_nsec = 0;
        local_cf8 = 0;
        uStack_cf0 = 0;
        local_ce8 = 0;
        uStack_ce0 = 0;
        local_cd8 = 0;
        uStack_cd0 = 0;
        local_cc8 = 0;
        uStack_cc0 = 0;
        local_cb8 = 0;
        uStack_cb0 = 0;
        local_da8[0] = 0;
        local_da8[1] = 0;
        local_da8[2] = 0;
        local_da8[3] = 0;
        local_da8[4] = 0;
        local_da8[5] = 0;
        local_da8[6] = 0;
        local_da8[7] = 0;
        local_da8[8] = 0;
        local_da8[9] = 0;
        local_da8[10] = 0;
        local_da8[0xb] = 0;
        local_da8[0xc] = 0;
        local_da8[0xd] = 0;
        local_da8[0xe] = 0;
        local_da8[0xf] = 0;
        local_da8[0x10] = 0;
        local_da8[0x11] = 0;
        local_da8[0x12] = 0;
        local_da8[0x13] = 0;
        local_da8[0x14] = 0;
        local_da8[0x15] = 0;
        local_da8[0x16] = 0;
        local_da8[0x17] = 0;
        dVar17 = ABS(local_c20.MinAngle);
        if (ABS(local_c20.MinAngle) <= ABS(local_c20.MaxAngle)) {
          dVar17 = ABS(local_c20.MaxAngle);
        }
        local_da8[0x18] = 0;
        local_da8[0x19] = 0;
        local_da8[0x1a] = 0;
        local_da8[0x1b] = 0;
        local_da8[0x1c] = 0;
        local_da8[0x1d] = 0;
        local_da8[0x1e] = 0;
        local_da8[0x1f] = 0;
        lVar7 = (long)local_c20.rudderchan;
        local_da8[lVar7] =
             (int)(((((local_c20.MaxAngle - local_c20.MidAngle) * 0.0) / dVar17 + local_c20.MidAngle
                    ) * 500.0) / dVar17) + 0x5dc;
        lVar8 = (long)local_c20.rightthrusterchan;
        local_da8[lVar8] = 0x5dc;
        lVar11 = (long)local_c20.leftthrusterchan;
        local_da8[lVar11] = 0x5dc;
        lVar13 = (long)local_c20.rightfluxchan;
        local_da8[lVar13] = 0x5dc;
        lVar14 = (long)local_c20.leftfluxchan;
        local_da8[lVar14] = 0x5dc;
        iVar5 = local_da8[lVar7];
        if (1999 < local_da8[lVar7]) {
          iVar5 = 2000;
        }
        if (iVar5 < 0x3e9) {
          iVar5 = 1000;
        }
        local_da8[lVar7] = iVar5;
        iVar5 = local_da8[lVar8];
        if (1999 < iVar5) {
          iVar5 = 2000;
        }
        if (iVar5 < 0x3e9) {
          iVar5 = 1000;
        }
        local_da8[lVar8] = iVar5;
        iVar5 = local_da8[lVar11];
        if (1999 < iVar5) {
          iVar5 = 2000;
        }
        if (iVar5 < 0x3e9) {
          iVar5 = 1000;
        }
        local_da8[lVar11] = iVar5;
        iVar5 = local_da8[lVar13];
        if (1999 < iVar5) {
          iVar5 = 2000;
        }
        if (iVar5 < 0x3e9) {
          iVar5 = 1000;
        }
        local_da8[lVar13] = iVar5;
        iVar5 = 2000;
        if (local_da8[lVar14] < 2000) {
          iVar5 = local_da8[lVar14];
        }
        local_ca8 = 0;
        uStack_ca0 = 0;
        if (iVar5 < 0x3e9) {
          iVar5 = 1000;
        }
        local_c98 = 0;
        uStack_c90 = 0;
        local_da8[lVar14] = iVar5;
        *(undefined4 *)((long)&local_d08.tv_sec + lVar7 * 4) = 1;
        *(undefined4 *)((long)&local_d08.tv_sec + lVar8 * 4) = 1;
        *(undefined4 *)((long)&local_d08.tv_sec + lVar11 * 4) = 1;
        *(undefined4 *)((long)&local_d08.tv_sec + lVar13 * 4) = 1;
        *(undefined4 *)((long)&local_d08.tv_sec + lVar14 * 4) = 1;
      }
      SetAllPWMsSSC32(&local_c20,(int *)&local_d08,local_da8);
      goto LAB_0019ad2a;
    }
    if (robid != 0x2000) goto LAB_0019a8d5;
  }
  else if ((robid != 0x4000) && (robid != 0x8000)) {
    if (robid == 0x200000) {
      local_d08.tv_sec = 0;
      local_d08.tv_nsec = 0;
      local_cf8 = 0;
      uStack_cf0 = 0;
      local_ce8 = 0;
      uStack_ce0 = 0;
      local_cd8 = 0;
      uStack_cd0 = 0;
      local_cc8 = 0;
      uStack_cc0 = 0;
      local_cb8 = 0;
      uStack_cb0 = 0;
      local_da8[0] = 0;
      local_da8[1] = 0;
      local_da8[2] = 0;
      local_da8[3] = 0;
      local_da8[4] = 0;
      local_da8[5] = 0;
      local_da8[6] = 0;
      local_da8[7] = 0;
      local_da8[8] = 0;
      local_da8[9] = 0;
      local_da8[10] = 0;
      local_da8[0xb] = 0;
      local_da8[0xc] = 0;
      local_da8[0xd] = 0;
      local_da8[0xe] = 0;
      local_da8[0xf] = 0;
      local_da8[0x10] = 0;
      local_da8[0x11] = 0;
      local_da8[0x12] = 0;
      local_da8[0x13] = 0;
      local_da8[0x14] = 0;
      local_da8[0x15] = 0;
      local_da8[0x16] = 0;
      local_da8[0x17] = 0;
      dVar17 = ABS(local_c20.MinAngle);
      if (ABS(local_c20.MinAngle) <= ABS(local_c20.MaxAngle)) {
        dVar17 = ABS(local_c20.MaxAngle);
      }
      local_da8[0x18] = 0;
      local_da8[0x19] = 0;
      local_da8[0x1a] = 0;
      local_da8[0x1b] = 0;
      local_da8[0x1c] = 0;
      local_da8[0x1d] = 0;
      local_da8[0x1e] = 0;
      local_da8[0x1f] = 0;
      lVar7 = (long)local_c20.rudderchan;
      local_da8[lVar7] =
           (int)(((((local_c20.MaxAngle - local_c20.MidAngle) * 0.0) / dVar17 + local_c20.MidAngle)
                 * 500.0) / dVar17) + 0x5dc;
      lVar8 = (long)local_c20.rightthrusterchan;
      local_da8[lVar8] = 0x5dc;
      lVar11 = (long)local_c20.leftthrusterchan;
      local_da8[lVar11] = 0x5dc;
      lVar13 = (long)local_c20.rightfluxchan;
      local_da8[lVar13] = 0x5dc;
      lVar14 = (long)local_c20.leftfluxchan;
      local_da8[lVar14] = 0x5dc;
      iVar5 = local_da8[lVar7];
      if (1999 < local_da8[lVar7]) {
        iVar5 = 2000;
      }
      if (iVar5 < 0x3e9) {
        iVar5 = 1000;
      }
      local_da8[lVar7] = iVar5;
      iVar5 = local_da8[lVar8];
      if (1999 < iVar5) {
        iVar5 = 2000;
      }
      if (iVar5 < 0x3e9) {
        iVar5 = 1000;
      }
      local_da8[lVar8] = iVar5;
      iVar5 = local_da8[lVar11];
      if (1999 < iVar5) {
        iVar5 = 2000;
      }
      if (iVar5 < 0x3e9) {
        iVar5 = 1000;
      }
      local_da8[lVar11] = iVar5;
      iVar5 = local_da8[lVar13];
      if (1999 < iVar5) {
        iVar5 = 2000;
      }
      if (iVar5 < 0x3e9) {
        iVar5 = 1000;
      }
      local_da8[lVar13] = iVar5;
      iVar5 = 2000;
      if (local_da8[lVar14] < 2000) {
        iVar5 = local_da8[lVar14];
      }
      local_ca8 = 0;
      uStack_ca0 = 0;
      if (iVar5 < 0x3e9) {
        iVar5 = 1000;
      }
      local_c98 = 0;
      uStack_c90 = 0;
      local_da8[lVar14] = iVar5;
      *(undefined4 *)((long)&local_d08.tv_sec + lVar7 * 4) = 1;
      *(undefined4 *)((long)&local_d08.tv_sec + lVar8 * 4) = 1;
      *(undefined4 *)((long)&local_d08.tv_sec + lVar11 * 4) = 1;
      *(undefined4 *)((long)&local_d08.tv_sec + lVar13 * 4) = 1;
      *(undefined4 *)((long)&local_d08.tv_sec + lVar14 * 4) = 1;
    }
    else {
LAB_0019a8d5:
      local_d08.tv_sec = 0;
      local_d08.tv_nsec = 0;
      local_cf8 = 0;
      uStack_cf0 = 0;
      local_ce8 = 0;
      uStack_ce0 = 0;
      local_cd8 = 0;
      uStack_cd0 = 0;
      local_cc8 = 0;
      uStack_cc0 = 0;
      local_cb8 = 0;
      uStack_cb0 = 0;
      local_ca8 = 0;
      uStack_ca0 = 0;
      local_da8[0] = 0;
      local_da8[1] = 0;
      local_da8[2] = 0;
      local_da8[3] = 0;
      local_da8[4] = 0;
      local_da8[5] = 0;
      local_da8[6] = 0;
      local_da8[7] = 0;
      local_da8[8] = 0;
      local_da8[9] = 0;
      local_da8[10] = 0;
      local_da8[0xb] = 0;
      local_da8[0xc] = 0;
      local_da8[0xd] = 0;
      local_da8[0xe] = 0;
      local_da8[0xf] = 0;
      local_da8[0x10] = 0;
      local_da8[0x11] = 0;
      local_da8[0x12] = 0;
      local_da8[0x13] = 0;
      local_da8[0x14] = 0;
      local_da8[0x15] = 0;
      local_da8[0x16] = 0;
      local_da8[0x17] = 0;
      local_da8[0x18] = 0;
      local_da8[0x19] = 0;
      local_da8[0x1a] = 0;
      local_da8[0x1b] = 0;
      local_da8[0x1c] = 0;
      local_da8[0x1d] = 0;
      local_da8[0x1e] = 0;
      local_da8[0x1f] = 0;
      lVar7 = (long)local_c20.rightthrusterchan;
      local_da8[lVar7] = 0x5dc;
      lVar8 = (long)local_c20.leftthrusterchan;
      local_da8[lVar8] = 0x5dc;
      iVar5 = local_da8[lVar7];
      if (1999 < iVar5) {
        iVar5 = 2000;
      }
      if (iVar5 < 0x3e9) {
        iVar5 = 1000;
      }
      local_da8[lVar7] = iVar5;
      iVar5 = 2000;
      if (local_da8[lVar8] < 2000) {
        iVar5 = local_da8[lVar8];
      }
      local_c98 = 0;
      uStack_c90 = 0;
      if (iVar5 < 0x3e9) {
        iVar5 = 1000;
      }
      local_da8[lVar8] = iVar5;
      *(undefined4 *)((long)&local_d08.tv_sec + lVar7 * 4) = 1;
      *(undefined4 *)((long)&local_d08.tv_sec + lVar8 * 4) = 1;
    }
    SetAllPWMsSSC32(&local_c20,(int *)&local_d08,local_da8);
LAB_0019ad2a:
    local_d08.tv_nsec = (long)((local_db4 % 1000) * 1000000);
    local_d08.tv_sec = (__time_t)(local_db4 / 1000);
    nanosleep(&local_d08,(timespec *)0x0);
  }
  if (local_c40 == 0) {
    clock_gettime(4,&local_d08);
    local_c70 = local_d08.tv_sec;
    lStack_c68 = local_d08.tv_nsec;
    local_d08.tv_sec =
         ((local_d08.tv_sec + local_c60) - local_c80.tv_sec) +
         (local_d08.tv_nsec + lStack_c58) / 1000000000;
    local_d08.tv_nsec = (local_d08.tv_nsec + lStack_c58) % 1000000000 - local_c80.tv_nsec;
    if (local_d08.tv_nsec < 0) {
      local_d08.tv_sec = local_d08.tv_sec + ~((ulong)-local_d08.tv_nsec / 1000000000);
      local_d08.tv_nsec =
           local_d08.tv_nsec + 1000000000 + ((ulong)-local_d08.tv_nsec / 1000000000) * 1000000000;
    }
    local_c60 = local_d08.tv_sec;
    lStack_c58 = local_d08.tv_nsec;
  }
  if ((FILE *)local_c20.pfSaveFile != (FILE *)0x0) {
    fclose((FILE *)local_c20.pfSaveFile);
    local_c20.pfSaveFile = (FILE *)0x0;
  }
  if (bVar15) goto LAB_0019aeaf;
  switch(local_c20.RS232Port.DevType) {
  case 0:
    goto LAB_0019ae8f;
  case 1:
  case 3:
    SVar10 = local_c20.RS232Port.s;
    break;
  case 2:
    shutdown(local_c20.RS232Port.s,2);
    close(local_c20.RS232Port.s);
  case 4:
    SVar10 = local_c20.RS232Port.s_srv;
    break;
  default:
    goto switchD_0019ae57_default;
  }
  shutdown(SVar10,2);
  local_c20.RS232Port.hDev._0_4_ = SVar10;
LAB_0019ae8f:
  iVar5 = close((int)local_c20.RS232Port.hDev);
  if (iVar5 == 0) {
    pcVar12 = "SSC32 disconnected.";
  }
  else {
switchD_0019ae57_default:
    pcVar12 = "SSC32 disconnection failed.";
  }
  puts(pcVar12);
LAB_0019aeaf:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SSC32Thread(void* pParam)
{
	SSC32 ssc32;
	double rudder = 0, thrust = 0, flux = 0;
	double thrust1 = 0, thrust2 = 0;
	BOOL bRudderChecked = FALSE;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&ssc32, 0, sizeof(SSC32));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		mSleep(threadperiod);

		if (bPauseSSC32) 
		{
			if (bConnected)
			{
				printf("SSC32 paused.\n");
				bConnected = FALSE;
				DisconnectSSC32(&ssc32);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartSSC32) 
		{
			if (bConnected)
			{
				printf("Restarting a SSC32.\n");
				bConnected = FALSE;
				DisconnectSSC32(&ssc32);
			}
			bRestartSSC32 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectSSC32(&ssc32, "SSC320.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = ssc32.threadperiod;

				if (ssc32.pfSaveFile != NULL)
				{
					fclose(ssc32.pfSaveFile); 
					ssc32.pfSaveFile = NULL;
				}
				if ((ssc32.bSaveRawData)&&(ssc32.pfSaveFile == NULL)) 
				{
					if (strlen(ssc32.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", ssc32.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "ssc32");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					ssc32.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (ssc32.pfSaveFile == NULL) 
					{
						printf("Unable to create SSC32 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			switch (robid)
			{
			case BUGGY_ROBID:
			case SAILBOAT_ROBID:
			case SAILBOAT2_ROBID:
				EnterCriticalSection(&StateVariablesCS);
				rudderminangle = ssc32.MinAngle; ruddermidangle = ssc32.MidAngle; ruddermaxangle = ssc32.MaxAngle;
				rudder = -uw_f*max(fabs(ssc32.MinAngle), fabs(ssc32.MaxAngle));
				thrust = u_f;
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderThrusterSSC32(&ssc32, rudder, thrust) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				break;
			case VAIMOS_ROBID:
				if ((bCheckRudder)&&(!bRudderChecked))
				{
					if (CheckRudderSSC32(&ssc32) != EXIT_SUCCESS)
					{
						printf("Connection to a SSC32 lost.\n");
						bConnected = FALSE;
						DisconnectSSC32(&ssc32);
						break;
					}
					bRudderChecked = TRUE;
				}
				EnterCriticalSection(&StateVariablesCS);
				rudderminangle = ssc32.MinAngle; ruddermidangle = ssc32.MidAngle; ruddermaxangle = ssc32.MaxAngle;
				rudder = -uw_f*max(fabs(ssc32.MinAngle), fabs(ssc32.MaxAngle));
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderSSC32(&ssc32, rudder) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				break;
			case MOTORBOAT_ROBID:
				EnterCriticalSection(&StateVariablesCS);
				rudderminangle = ssc32.MinAngle; ruddermidangle = ssc32.MidAngle; ruddermaxangle = ssc32.MaxAngle;
				rudder = -uw_f*max(fabs(ssc32.MinAngle), fabs(ssc32.MaxAngle));
				if (bEnableFluxMotorboat)
				{
				thrust = fabs(u_f);
				if (bEnableBackwardsMotorboat)
				{
					if (u_f < 0) flux = -1; else flux = 1;
				}
				else
				{
					if (u_f < 0) thrust = 0;
					flux = 1;
				}
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderThrustersFluxSSC32(&ssc32, rudder, thrust, thrust, flux, flux) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				}
				else
				{
				thrust = u_f;
				if (!bEnableBackwardsMotorboat)
				{
					if (u_f < 0) thrust = 0;
				}
				LeaveCriticalSection(&StateVariablesCS);
				if (SetRudderThrusterSSC32(&ssc32, rudder, thrust) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				}
				break;
			case BUBBLE_ROBID:
			case ETAS_WHEEL_ROBID:
			default:
				EnterCriticalSection(&StateVariablesCS);
				thrust1 = u1;
				thrust2 = u2;
				LeaveCriticalSection(&StateVariablesCS);
				if (SetThrustersSSC32(&ssc32, thrust1, thrust2) != EXIT_SUCCESS)
				{
					printf("Connection to a SSC32 lost.\n");
					bConnected = FALSE;
					DisconnectSSC32(&ssc32);
					break;
				}
				break;
			}
		}

		//printf("SSC32Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	switch (robid)
	{
	case BUGGY_ROBID:
		SetRudderThrustersFluxSSC32(&ssc32, 0, 0, 0, 0, 0);
		mSleep(threadperiod);
		break;
	case SAILBOAT_ROBID:
	case SAILBOAT2_ROBID:
	case VAIMOS_ROBID:
		break;
	case MOTORBOAT_ROBID:
		if (bEnableFluxMotorboat) SetRudderThrustersFluxSSC32(&ssc32, 0, 0, 0, 0, 0); else SetRudderThrusterSSC32(&ssc32, 0, 0);
		mSleep(threadperiod);
		break;
	case BUBBLE_ROBID:
	case ETAS_WHEEL_ROBID:
	default:
		SetThrustersSSC32(&ssc32, 0, 0);
		mSleep(threadperiod);
		break;
	}

	StopChronoQuick(&chrono_period);

	if (ssc32.pfSaveFile != NULL)
	{
		fclose(ssc32.pfSaveFile); 
		ssc32.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectSSC32(&ssc32);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}